

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void sf::priv::GlContext::acquireTransientContext(void)

{
  TransientContext *pTVar1;
  Lock lock;
  TransientContext *in_stack_ffffffffffffffc8;
  ThreadLocalPtr<(anonymous_namespace)::TransientContext> *in_stack_ffffffffffffffd0;
  Mutex *in_stack_ffffffffffffffd8;
  Lock *in_stack_ffffffffffffffe0;
  TransientContext *in_stack_fffffffffffffff0;
  
  Lock::Lock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pTVar1 = ThreadLocalPtr::operator_cast_to_TransientContext_
                     ((ThreadLocalPtr<(anonymous_namespace)::TransientContext> *)0x176e31);
  if (pTVar1 == (TransientContext *)0x0) {
    operator_new(0x20);
    anon_unknown.dwarf_b182a::TransientContext::TransientContext(in_stack_fffffffffffffff0);
    ThreadLocalPtr<(anonymous_namespace)::TransientContext>::operator=
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pTVar1 = ThreadLocalPtr<(anonymous_namespace)::TransientContext>::operator->
                     ((ThreadLocalPtr<(anonymous_namespace)::TransientContext> *)0x176eb0);
  pTVar1->referenceCount = pTVar1->referenceCount + 1;
  Lock::~Lock((Lock *)pTVar1);
  return;
}

Assistant:

void GlContext::acquireTransientContext()
{
    // Protect from concurrent access
    Lock lock(mutex);

    // If this is the first TransientContextLock on this thread
    // construct the state object
    if (!transientContext)
        transientContext = new TransientContext;

    // Increase the reference count
    transientContext->referenceCount++;
}